

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseLimitsIndex(WastParser *this,Limits *out_limits)

{
  bool bVar1;
  TokenType TVar2;
  Token TStack_58;
  
  TVar2 = Peek(this,0);
  if (TVar2 == First_Type) {
    GetToken(&TStack_58,this);
    if (3 < TStack_58.token_type_ - First_Type) {
LAB_0018f1ec:
      __assert_fail("HasType()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                    ,0x68,"Type wabt::Token::type() const");
    }
    if (TStack_58.field_2.type_.enum_ == I64) {
      Consume(&TStack_58,this);
      bVar1 = true;
    }
    else {
      GetToken(&TStack_58,this);
      if (3 < TStack_58.token_type_ - First_Type) goto LAB_0018f1ec;
      if (TStack_58.field_2.type_.enum_ != I32) {
        return (Result)Ok;
      }
      Consume(&TStack_58,this);
      bVar1 = false;
    }
    out_limits->is_64 = bVar1;
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseLimitsIndex(Limits* out_limits) {
  WABT_TRACE(ParseLimitsIndex);

  if (PeekMatch(TokenType::ValueType)) {
    if (GetToken().type() == Type::I64) {
      Consume();
      out_limits->is_64 = true;
    } else if (GetToken().type() == Type::I32) {
      Consume();
      out_limits->is_64 = false;
    }
  }

  return Result::Ok;
}